

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O1

void Ssc_GiaSavePiPattern(Gia_Man_t *p,Vec_Int_t *vPat)

{
  uint *puVar1;
  Vec_Wrd_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  word *pwVar5;
  long lVar6;
  
  iVar4 = p->vCis->nSize;
  if (vPat->nSize != iVar4) {
    __assert_fail("Vec_IntSize(vPat) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                  ,0x99,"void Ssc_GiaSavePiPattern(Gia_Man_t *, Vec_Int_t *)");
  }
  if (p->iPatsPi == (p->vSimsPi->nSize / (iVar4 - p->nRegs)) * 0x40) {
    Vec_WrdDoubleSimInfo(p->vSimsPi,iVar4);
  }
  pVVar2 = p->vSimsPi;
  pVVar3 = p->vCis;
  iVar4 = pVVar2->nSize / (pVVar3->nSize - p->nRegs);
  if (SBORROW4(p->iPatsPi,iVar4 * 0x40) != p->iPatsPi + iVar4 * -0x40 < 0) {
    if (pVVar2->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    if (0 < pVVar3->nSize) {
      pwVar5 = pVVar2->pArray;
      lVar6 = 0;
      do {
        if (vPat->nSize <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (vPat->pArray[lVar6] != 0) {
          puVar1 = (uint *)((long)pwVar5 + (long)(p->iPatsPi >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)p->iPatsPi & 0x1f);
        }
        lVar6 = lVar6 + 1;
        pwVar5 = pwVar5 + pVVar2->nSize / (pVVar3->nSize - p->nRegs);
      } while (lVar6 < pVVar3->nSize);
    }
    p->iPatsPi = p->iPatsPi + 1;
    return;
  }
  __assert_fail("p->iPatsPi < 64 * Gia_ObjSimWords(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                ,0x9c,"void Ssc_GiaSavePiPattern(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

void Ssc_GiaSavePiPattern( Gia_Man_t * p, Vec_Int_t * vPat )
{
    word * pSimPi;
    int i;
    assert( Vec_IntSize(vPat) == Gia_ManCiNum(p) );
    if ( p->iPatsPi == 64 * Gia_ObjSimWords(p) )
        Vec_WrdDoubleSimInfo( p->vSimsPi, Gia_ManCiNum(p) );
    assert( p->iPatsPi < 64 * Gia_ObjSimWords(p) );
    pSimPi = Gia_ObjSimPi( p, 0 );
    for ( i = 0; i < Gia_ManCiNum(p); i++, pSimPi += Gia_ObjSimWords(p) )
        if ( Vec_IntEntry(vPat, i) )
            Abc_InfoSetBit( (unsigned *)pSimPi, p->iPatsPi );
    p->iPatsPi++;
}